

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O1

CTypeID cp_decl_struct(CPState *cp,CPDecl *sdecl,CTInfo sinfo)

{
  CType *pCVar1;
  ushort uVar2;
  CTypeID CVar3;
  CPscl CVar4;
  CTypeID ctypeid;
  CTypeID CVar5;
  CTInfo CVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  CType *pCVar11;
  uint uVar12;
  ulong uVar13;
  int *piVar14;
  CTSize CVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  CTypeID CVar20;
  CTInfo CVar21;
  bool bVar22;
  CType *ct;
  CPDecl decl;
  CType *local_6d0;
  uint local_6c4;
  long local_6c0;
  CType *local_6b8;
  CPDecl local_6b0;
  
  CVar3 = cp_struct_name(cp,sdecl,sinfo);
  if (cp->tok == 0x7b) {
    cp_next(cp);
    CVar5 = CVar3;
    if (cp->tok != 0x7d) {
      bVar22 = false;
LAB_0013b523:
      CVar4 = cp_decl_spec(cp,&local_6b0,0x20000);
      local_6b0.mode = 4;
      CVar20 = CVar5;
      if (CVar4 == 0) {
        local_6b0.mode = 0xe;
      }
      do {
        if (bVar22) {
          cp_err_token(cp,0x7d);
        }
        local_6b0.bits = 0xffffffff;
        cp_declarator(cp,&local_6b0);
        ctypeid = cp_decl_intern(cp,&local_6b0);
        if ((CVar4 >> 0x11 & 1) == 0) {
          CVar5 = lj_ctype_new(cp->cts,&local_6d0);
          pCVar1 = cp->cts->tab;
          uVar16 = pCVar1[ctypeid].info;
          pCVar11 = pCVar1 + ctypeid;
          if (local_6b0.bits == 0xffffffff) {
            bVar22 = false;
            if ((uVar16 & 0xf0000000) == 0x30000000) {
              bVar22 = pCVar11->size == 0xffffffff;
            }
            CVar15 = 0x7f;
            if (local_6b0.name != (GCstr *)0x0) goto LAB_0013b672;
            if ((uVar16 & 0xf0000000) != 0x50000000 && (uVar16 & 0xf0100000) != 0x10000000) {
              cp_err_token(cp,0x100);
            }
            local_6d0->info = ctypeid + 0x80030000;
            uVar16 = local_6b0.attr | 0x80000000;
            if ((pCVar11->info & 0xf0000000) != 0x10000000) {
              uVar16 = 0;
            }
            local_6d0->size = uVar16;
          }
          else {
            if (((uVar16 & 0xf4000000) != 0) ||
               (((local_6b0.bits == 0 && (local_6b0.name != (GCstr *)0x0)) ||
                (uVar7 = pCVar11->size << 3, 0x20 < uVar7)))) {
LAB_0013ba1f:
              cp_errmsg(cp,0x3a,LJ_ERR_BADVAL);
            }
            if (0x7ffffff < uVar16) {
              uVar7 = 1;
            }
            bVar22 = false;
            CVar15 = local_6b0.bits;
            if (uVar7 < local_6b0.bits) goto LAB_0013ba1f;
LAB_0013b672:
            local_6d0->info = ctypeid + CVar15 * 0x10000 + 0x90000000;
            local_6d0->size = local_6b0.attr;
            if (local_6b0.name != (GCstr *)0x0) {
              (local_6b0.name)->marked = (local_6b0.name)->marked | 0x20;
              (local_6d0->name).gcptr32 = (uint32_t)local_6b0.name;
            }
          }
          pCVar1[CVar20].sib = (CTypeID1)CVar5;
        }
        else {
          CVar5 = cp_decl_constinit(cp,&local_6d0,ctypeid);
          cp->cts->tab[CVar20].sib = (CTypeID1)CVar5;
          (local_6b0.name)->marked = (local_6b0.name)->marked | 0x20;
          (local_6d0->name).gcptr32 = (uint32_t)local_6b0.name;
          bVar22 = false;
        }
        if (cp->tok != 0x2c) goto LAB_0013b745;
        cp_next(cp);
        local_6b0.pos = local_6b0.specpos;
        local_6b0.top = local_6b0.specpos + 1;
        local_6b0.stack[local_6b0.specpos].next = 0;
        local_6b0.attr = local_6b0.specattr;
        local_6b0.fattr = local_6b0.specfattr;
        local_6b0.name = (GCstr *)0x0;
        local_6b0.redir = (GCstr *)0x0;
        CVar20 = CVar5;
      } while( true );
    }
LAB_0013b75d:
    cp_check(cp,0x7d);
    cp->cts->tab[CVar5].sib = 0;
    cp_decl_attributes(cp,sdecl);
    local_6c4 = sdecl->attr;
    local_6b8 = cp->cts->tab;
    uVar13 = (ulong)CVar3;
    local_6c0 = uVar13 * 0x10;
    CVar21 = local_6b8[uVar13].info;
    uVar2 = local_6b8[uVar13].sib;
    uVar16 = local_6c4 >> 0x10 & 0xf;
    if (uVar2 == 0) {
      uVar7 = 0;
      uVar19 = 0;
    }
    else {
      uVar19 = 0;
      uVar7 = 0;
      do {
        pCVar11 = cp->cts->tab;
        pCVar1 = pCVar11 + uVar2;
        uVar12 = pCVar11[uVar2].size;
        if (((pCVar11[uVar2].info & 0xf0000000) == 0x90000000) ||
           (uVar12 != 0 && (pCVar11[uVar2].info & 0xf0ff0000) == 0x80030000)) {
          CVar6 = lj_ctype_info(cp->cts,(uint)(ushort)pCVar1->info,&local_6b0.top);
          if ((0x1fffffff < local_6b0.top) ||
             ((uVar10 = local_6b0.top * 8, ~uVar19 < uVar10 || ((CVar6 & 0x100000) != 0)))) {
            if ((local_6b0.top != 0xffffffff) ||
               (((CVar6 & 0xf0000000) != 0x30000000 || ((CVar21 & 0x800000) != 0)))) {
              cp_err(cp,LJ_ERR_FFI_INVSIZE);
            }
            local_6b0.top = 0;
            uVar10 = 0;
          }
          if ((((uVar12 | local_6c4) & 2) != 0) ||
             ((uVar17 = CVar6 >> 0x10 & 0xf, (uVar12 & 1) != 0 && (uVar17 < (uVar12 >> 0x10 & 0xf)))
             )) {
            uVar17 = uVar12 >> 0x10 & 0xf;
          }
          uVar8 = (uint)cp->packstack[cp->curpack];
          if (uVar17 < cp->packstack[cp->curpack]) {
            uVar8 = uVar17;
          }
          if (uVar16 < uVar8) {
            uVar16 = uVar8;
          }
          iVar18 = 8 << ((byte)uVar8 & 0x1f);
          uVar17 = iVar18 - 1;
          uVar8 = pCVar1->info;
          uVar9 = uVar8 >> 0x10 & 0x7f;
          if ((uVar8 & 0xf0000000) == 0x90000000 && uVar9 != 0x7f) {
            if (((uVar12 & 1) != 0 || uVar9 == 0) ||
               ((((uVar12 | local_6c4) & 2) == 0 && (uVar10 < (uVar17 & uVar19) + uVar9)))) {
              uVar19 = -iVar18 & uVar19 + uVar17;
            }
            if ((uVar9 == uVar10) && ((uVar17 & uVar19) == 0)) {
              pCVar1->info = uVar8 & 0x9000ffff;
              uVar10 = uVar9;
              uVar12 = uVar19;
            }
            else {
              pCVar1->info = uVar9 * 0x100 + uVar10 * 0x2000 + (CVar6 & 0xb800000) +
                             (uVar10 - 1 & uVar19) + 0xa0000000;
              uVar12 = -uVar10;
              uVar10 = uVar9;
              uVar12 = uVar12 & uVar19;
            }
          }
          else {
            uVar19 = -iVar18 & uVar17 + uVar19;
            uVar12 = uVar19;
          }
          uVar17 = uVar7;
          if (uVar7 < uVar10) {
            uVar17 = uVar10;
          }
          pCVar1->size = uVar12 >> 3;
          if ((CVar21 >> 0x17 & 1) != 0) {
            uVar10 = 0;
            uVar7 = uVar17;
          }
          uVar19 = uVar19 + uVar10;
          CVar21 = CVar6 & 0x3100000 | CVar21;
        }
        uVar2 = pCVar1->sib;
      } while (uVar2 != 0);
    }
    piVar14 = (int *)((long)&local_6b8->info + local_6c0);
    *piVar14 = uVar16 * 0x10000 + CVar21;
    if ((CVar21 >> 0x17 & 1) == 0) {
      uVar7 = uVar19;
    }
    iVar18 = 8 << ((byte)uVar16 & 0x1f);
    piVar14[1] = (-iVar18 & (iVar18 + uVar7) - 1) >> 3;
  }
  return CVar3;
LAB_0013b745:
  cp_check(cp,0x3b);
  if (cp->tok == 0x7d) goto LAB_0013b75d;
  goto LAB_0013b523;
}

Assistant:

static CTypeID cp_decl_struct(CPState *cp, CPDecl *sdecl, CTInfo sinfo)
{
  CTypeID sid = cp_struct_name(cp, sdecl, sinfo);
  if (cp_opt(cp, '{')) {  /* Struct/union definition. */
    CTypeID lastid = sid;
    int lastdecl = 0;
    while (cp->tok != '}') {
      CPDecl decl;
      CPscl scl = cp_decl_spec(cp, &decl, CDF_STATIC);
      decl.mode = scl ? CPARSE_MODE_DIRECT :
	CPARSE_MODE_DIRECT|CPARSE_MODE_ABSTRACT|CPARSE_MODE_FIELD;

      for (;;) {
	CTypeID ctypeid;

	if (lastdecl) cp_err_token(cp, '}');

	/* Parse field declarator. */
	decl.bits = CTSIZE_INVALID;
	cp_declarator(cp, &decl);
	ctypeid = cp_decl_intern(cp, &decl);

	if ((scl & CDF_STATIC)) {  /* Static constant in struct namespace. */
	  CType *ct;
	  CTypeID fieldid = cp_decl_constinit(cp, &ct, ctypeid);
	  ctype_get(cp->cts, lastid)->sib = fieldid;
	  lastid = fieldid;
	  ctype_setname(ct, decl.name);
	} else {
	  CTSize bsz = CTBSZ_FIELD;  /* Temp. for layout phase. */
	  CType *ct;
	  CTypeID fieldid = lj_ctype_new(cp->cts, &ct);  /* Do this first. */
	  CType *tct = ctype_raw(cp->cts, ctypeid);

	  if (decl.bits == CTSIZE_INVALID) {  /* Regular field. */
	    if (ctype_isarray(tct->info) && tct->size == CTSIZE_INVALID)
	      lastdecl = 1;  /* a[] or a[?] must be the last declared field. */

	    /* Accept transparent struct/union/enum. */
	    if (!decl.name) {
	      if (!((ctype_isstruct(tct->info) && !(tct->info & CTF_VLA)) ||
		    ctype_isenum(tct->info)))
		cp_err_token(cp, CTOK_IDENT);
	      ct->info = CTINFO(CT_ATTRIB, CTATTRIB(CTA_SUBTYPE) + ctypeid);
	      ct->size = ctype_isstruct(tct->info) ?
			 (decl.attr|0x80000000u) : 0;  /* For layout phase. */
	      goto add_field;
	    }
	  } else {  /* Bitfield. */
	    bsz = decl.bits;
	    if (!ctype_isinteger_or_bool(tct->info) ||
		(bsz == 0 && decl.name) || 8*tct->size > CTBSZ_MAX ||
		bsz > ((tct->info & CTF_BOOL) ? 1 : 8*tct->size))
	      cp_errmsg(cp, ':', LJ_ERR_BADVAL);
	  }

	  /* Create temporary field for layout phase. */
	  ct->info = CTINFO(CT_FIELD, ctypeid + (bsz << CTSHIFT_BITCSZ));
	  ct->size = decl.attr;
	  if (decl.name) ctype_setname(ct, decl.name);

	add_field:
	  ctype_get(cp->cts, lastid)->sib = fieldid;
	  lastid = fieldid;
	}
	if (!cp_opt(cp, ',')) break;
	cp_decl_reset(&decl);
      }
      cp_check(cp, ';');
    }
    cp_check(cp, '}');
    ctype_get(cp->cts, lastid)->sib = 0;  /* Drop sib = 1 for empty structs. */
    cp_decl_attributes(cp, sdecl);  /* Layout phase needs postfix attributes. */
    cp_struct_layout(cp, sid, sdecl->attr);
  }
  return sid;
}